

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPrivkey * __thiscall
cfd::core::HDWallet::GeneratePrivkey
          (ExtPrivkey *__return_storage_ptr__,HDWallet *this,NetType network_type,
          string *string_path)

{
  ExtPrivkey privkey;
  ExtPrivkey local_90;
  
  ExtPrivkey::ExtPrivkey(&local_90,&this->seed_,network_type);
  ExtPrivkey::DerivePrivkey(__return_storage_ptr__,&local_90,string_path);
  ExtPrivkey::~ExtPrivkey(&local_90);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey HDWallet::GeneratePrivkey(
    NetType network_type, const std::string& string_path) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.DerivePrivkey(string_path);
}